

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_compilation.cpp
# Opt level: O0

void __thiscall
ExchangeCompilation_TwoDefinitions_Test::TestBody(ExchangeCompilation_TwoDefinitions_Test *this)

{
  allocator<pstore::repo::definition> *this_00;
  digest d;
  digest d_00;
  extent<pstore::repo::fragment> x;
  initializer_list<pstore::repo::definition> __l;
  bool bVar1;
  uint generation;
  iterator first;
  iterator last;
  mapped_type *pmVar2;
  element_type *peVar3;
  string *psVar4;
  parser<pstore::exchange::import_ns::callbacks> *ppVar5;
  Message *pMVar6;
  error_code *peVar7;
  char *pcVar8;
  char *pcVar9;
  element_type *peVar10;
  __uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  _Var11;
  typed_address<pstore::indirect_string> addr;
  database *pdVar12;
  insert_iterator<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::typed_address<pstore::indirect_string>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::typed_address<pstore::indirect_string>_>_>_>_>
  out;
  extent<pstore::repo::fragment> eVar13;
  extent<pstore::repo::compilation> eVar14;
  undefined4 in_stack_fffffffffffff09c;
  undefined4 in_stack_fffffffffffff0a4;
  AssertHelper local_c98;
  Message local_c90;
  visibility local_c82;
  visibility local_c81;
  undefined1 local_c80 [8];
  AssertionResult gtest_ar_10;
  Message local_c68;
  linkage local_c5a;
  linkage local_c59;
  undefined1 local_c58 [8];
  AssertionResult gtest_ar_9;
  Message local_c40;
  database *local_c38;
  string local_c30;
  undefined1 local_c10 [8];
  AssertionResult gtest_ar_8;
  Message local_bf8;
  undefined1 local_bf0 [8];
  AssertionResult gtest_ar_7;
  definition *def2;
  Message local_bd0;
  visibility local_bc2;
  visibility local_bc1;
  undefined1 local_bc0 [8];
  AssertionResult gtest_ar_6;
  Message local_ba8;
  linkage local_b9a;
  linkage local_b99;
  undefined1 local_b98 [8];
  AssertionResult gtest_ar_5;
  Message local_b80;
  database *local_b78;
  string local_b70;
  undefined1 local_b50 [8];
  AssertionResult gtest_ar_4;
  Message local_b38;
  undefined1 local_b30 [8];
  AssertionResult gtest_ar_3;
  definition *def1;
  Message local_b10;
  uint local_b08;
  size_type local_b04;
  undefined1 local_b00 [8];
  AssertionResult gtest_ar_2;
  Message local_ae8;
  address local_ae0;
  string local_ad8;
  undefined1 local_ab8 [8];
  AssertionResult gtest_ar_1;
  shared_ptr<const_pstore::repo::compilation> compilation;
  Message local_a90;
  iterator local_a88;
  undefined1 local_998 [8];
  AssertionResult gtest_ar;
  const_iterator pos;
  shared_ptr<pstore::index::hamt_map<pstore::uint128,_pstore::extent<pstore::repo::compilation>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>_>
  compilation_index;
  AssertHelper local_868;
  char local_85d;
  coord local_85c;
  char local_851;
  string local_850;
  Message local_830;
  bool local_821;
  undefined1 local_820 [8];
  AssertionResult gtest_ar__2;
  parser<pstore::exchange::import_ns::callbacks> compilation_parser;
  shared_ptr<pstore::index::hamt_map<pstore::uint128,_pstore::extent<pstore::repo::fragment>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>_>
  fragment_index;
  AssertHelper local_738;
  char local_72d;
  coord local_72c;
  char local_721;
  string local_720;
  Message local_700;
  bool local_6f1;
  undefined1 local_6f0 [8];
  AssertionResult gtest_ar__1;
  parser<pstore::exchange::import_ns::callbacks> fragment_parser;
  string local_630;
  AssertHelper local_610;
  char local_605;
  coord local_604;
  char local_5f9;
  string local_5f8;
  Message local_5d8;
  bool local_5c9;
  undefined1 local_5c8 [8];
  AssertionResult gtest_ar_;
  parser<pstore::exchange::import_ns::callbacks> name_parser;
  string_mapping imported_names;
  undefined1 local_480 [8];
  transaction<std::unique_lock<mock_mutex>_> transaction;
  undefined1 local_440 [7];
  mock_mutex mutex;
  indent local_42c;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_428;
  __normal_iterator<pstore::repo::definition_*,_std::vector<pstore::repo::definition,_std::allocator<pstore::repo::definition>_>_>
  local_420;
  allocator local_411;
  key_type local_410;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_3f0;
  address local_3e8;
  extent<pstore::repo::compilation> compilation_1;
  key_type local_3d0;
  typed_address<pstore::trailer> local_3b0;
  typed_address<pstore::indirect_string> local_3a8;
  address aStack_3a0;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_398;
  element_type *peStack_390;
  allocator local_381;
  key_type local_380;
  element_type *local_360;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_358;
  address aStack_350;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_348;
  element_type *peStack_340;
  definition local_338;
  definition local_308;
  iterator local_2d8;
  size_type local_2d0;
  undefined1 local_2c8 [8];
  vector<pstore::repo::definition,_std::allocator<pstore::repo::definition>_> definitions;
  indent local_29c;
  address aStack_298;
  extent<pstore::repo::fragment> fext;
  undefined1 local_278 [8];
  transaction<std::unique_lock<mock_mutex>_> transaction_1;
  undefined1 local_238 [7];
  mock_mutex mutex_1;
  ostringstream exported_fragment_stream;
  ostringstream exported_compilation_stream;
  digest fragment_digest;
  digest compilation_digest;
  string local_170;
  indent local_14c;
  undefined1 local_148 [8];
  ostringstream exported_names_stream;
  undefined1 local_f0 [8];
  string_mapping exported_names;
  undefined1 local_90 [8];
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::typed_address<pstore::indirect_string>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::typed_address<pstore::indirect_string>_>_>_>
  indir_strings;
  array<const_char_*,_3UL> names;
  char *pcStack_30;
  indices name_index;
  char *triple;
  char *name2;
  char *name1;
  ExchangeCompilation_TwoDefinitions_Test *pEStack_10;
  bool comments;
  ExchangeCompilation_TwoDefinitions_Test *this_local;
  
  name1._7_1_ = 0;
  name2 = "name1";
  triple = "name2";
  pcStack_30 = "triple";
  indir_strings._M_h._M_single_bucket = (__node_base_ptr)anon_var_dwarf_a465b;
  pEStack_10 = this;
  std::
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::typed_address<pstore::indirect_string>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::typed_address<pstore::indirect_string>_>_>_>
  ::unordered_map((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::typed_address<pstore::indirect_string>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::typed_address<pstore::indirect_string>_>_>_>
                   *)local_90);
  first = std::begin<std::array<char_const*,3ul>>
                    ((array<const_char_*,_3UL> *)&indir_strings._M_h._M_single_bucket);
  last = std::end<std::array<char_const*,3ul>>
                   ((array<const_char_*,_3UL> *)&indir_strings._M_h._M_single_bucket);
  exported_names.strings_._M_h._M_single_bucket =
       (__node_base_ptr)
       std::
       end<std::unordered_map<std::__cxx11::string,pstore::typed_address<pstore::indirect_string>,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,pstore::typed_address<pstore::indirect_string>>>>>
                 ((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::typed_address<pstore::indirect_string>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::typed_address<pstore::indirect_string>_>_>_>
                   *)local_90);
  out = std::
        inserter<std::unordered_map<std::__cxx11::string,pstore::typed_address<pstore::indirect_string>,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,pstore::typed_address<pstore::indirect_string>>>>>
                  ((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::typed_address<pstore::indirect_string>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::typed_address<pstore::indirect_string>_>_>_>
                    *)local_90,(iterator)exported_names.strings_._M_h._M_single_bucket);
  add_export_strings<(pstore::trailer::indices)3,char_const**,std::insert_iterator<std::unordered_map<std::__cxx11::string,pstore::typed_address<pstore::indirect_string>,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,pstore::typed_address<pstore::indirect_string>>>>>>
            (&(this->super_ExchangeCompilation).export_db_,first,last,out);
  pstore::exchange::export_ns::name_index_tag();
  pstore::exchange::export_ns::string_mapping::string_mapping<(pstore::trailer::indices)3>
            ((string_mapping *)local_f0,&(this->super_ExchangeCompilation).export_db_);
  pstore::exchange::export_ns::ostringstream::ostringstream((ostringstream *)local_148);
  local_14c.distance_ = 0;
  pstore::exchange::export_ns::indent::indent(&local_14c);
  pdVar12 = &(this->super_ExchangeCompilation).export_db_;
  generation = pstore::database::get_current_revision(pdVar12);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_170,"",(allocator *)((long)&compilation_digest.v_ + 0xf));
  pstore::exchange::export_ns::emit_strings<(pstore::trailer::indices)3>
            ((ostream_base *)local_148,local_14c,pdVar12,generation,&local_170,
             (string_mapping *)local_f0,false);
  std::__cxx11::string::~string((string *)&local_170);
  std::allocator<char>::~allocator((allocator<char> *)((long)&compilation_digest.v_ + 0xf));
  fragment_digest.v_._8_8_ = 0x9abcdef0;
  compilation_digest.v_._0_8_ = 0x12345678;
  exported_compilation_stream.str_.field_2._8_8_ = 0x12345678;
  fragment_digest.v_._0_8_ = (element_type *)0x9abcdef0;
  pstore::exchange::export_ns::ostringstream::ostringstream
            ((ostringstream *)((long)&exported_fragment_stream.str_.field_2 + 8));
  pstore::exchange::export_ns::ostringstream::ostringstream((ostringstream *)local_238);
  std::unique_lock<mock_mutex>::unique_lock
            ((unique_lock<mock_mutex> *)&fext.size,(mutex_type *)&transaction_1.lock_.field_0xf);
  ::begin((transaction<std::unique_lock<mock_mutex>_> *)local_278,
          &(this->super_ExchangeCompilation).export_db_,(unique_lock<mock_mutex> *)&fext.size);
  std::unique_lock<mock_mutex>::~unique_lock((unique_lock<mock_mutex> *)&fext.size);
  eVar13 = anon_unknown.dwarf_944bc::build_fragment
                     ((transaction *)local_278,
                      (digest *)((long)&exported_compilation_stream.str_.field_2 + 8));
  fext.addr.a_.a_ = (address)eVar13.size;
  aStack_298.a_ = (value_type)eVar13.addr.a_.a_;
  local_29c.distance_ = 0;
  pstore::exchange::export_ns::indent::indent(&local_29c);
  pdVar12 = &(this->super_ExchangeCompilation).export_db_;
  pstore::database::getro<pstore::repo::fragment,void>
            ((database *)
             &definitions.
              super__Vector_base<pstore::repo::definition,_std::allocator<pstore::repo::definition>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,
             (extent<pstore::repo::fragment> *)pdVar12);
  pstore::exchange::export_ns::emit_fragment
            ((ostream_base *)local_238,local_29c,pdVar12,(string_mapping *)local_f0,
             (shared_ptr<const_pstore::repo::fragment> *)
             &definitions.
              super__Vector_base<pstore::repo::definition,_std::allocator<pstore::repo::definition>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,false);
  std::shared_ptr<const_pstore::repo::fragment>::~shared_ptr
            ((shared_ptr<const_pstore::repo::fragment> *)
             &definitions.
              super__Vector_base<pstore::repo::definition,_std::allocator<pstore::repo::definition>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  local_348._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
       exported_compilation_stream.str_.field_2._8_8_;
  peStack_340 = (element_type *)fragment_digest.v_;
  local_358._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)aStack_298.a_;
  aStack_350 = fext.addr.a_.a_;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_380,"name1",&local_381);
  pmVar2 = std::
           unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::typed_address<pstore::indirect_string>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::typed_address<pstore::indirect_string>_>_>_>
           ::operator[]((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::typed_address<pstore::indirect_string>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::typed_address<pstore::indirect_string>_>_>_>
                         *)local_90,&local_380);
  local_360 = (element_type *)(pmVar2->a_).a_;
  x.size = (uint64_t)peStack_340;
  x.addr.a_.a_ = (address)(address)local_348._M_pi;
  d.v_._4_4_ = in_stack_fffffffffffff09c;
  d.v_._0_4_ = 4;
  d.v_._8_4_ = 1;
  d.v_._12_4_ = in_stack_fffffffffffff0a4;
  pstore::repo::definition::definition
            (&local_338,d,x,(typed_address<pstore::indirect_string>)local_358._M_pi,
             (linkage)aStack_350.a_,(visibility)local_360);
  local_398._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
       exported_compilation_stream.str_.field_2._8_8_;
  peStack_390 = (element_type *)fragment_digest.v_;
  local_3a8.a_.a_ = (address)(address)aStack_298.a_;
  aStack_3a0 = fext.addr.a_.a_;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_3d0,"name2",(allocator *)((long)&compilation_1.size + 7));
  pmVar2 = std::
           unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::typed_address<pstore::indirect_string>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::typed_address<pstore::indirect_string>_>_>_>
           ::operator[]((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::typed_address<pstore::indirect_string>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::typed_address<pstore::indirect_string>_>_>_>
                         *)local_90,&local_3d0);
  local_3b0.a_.a_ = (address)(pmVar2->a_).a_;
  eVar13.size = (uint64_t)peStack_390;
  eVar13.addr.a_.a_ = (address)(address)local_398._M_pi;
  d_00.v_._4_4_ = in_stack_fffffffffffff09c;
  d_00.v_._0_4_ = 5;
  d_00.v_._8_4_ = 0;
  d_00.v_._12_4_ = in_stack_fffffffffffff0a4;
  pstore::repo::definition::definition
            (&local_308,d_00,eVar13,local_3a8,(linkage)aStack_3a0.a_,SUB81(local_3b0.a_.a_,0));
  local_2d8 = &local_338;
  local_2d0 = 2;
  this_00 = (allocator<pstore::repo::definition> *)((long)&compilation_1.size + 6);
  std::allocator<pstore::repo::definition>::allocator(this_00);
  __l._M_len = local_2d0;
  __l._M_array = local_2d8;
  std::vector<pstore::repo::definition,_std::allocator<pstore::repo::definition>_>::vector
            ((vector<pstore::repo::definition,_std::allocator<pstore::repo::definition>_> *)
             local_2c8,__l,this_00);
  std::allocator<pstore::repo::definition>::~allocator
            ((allocator<pstore::repo::definition> *)((long)&compilation_1.size + 6));
  std::__cxx11::string::~string((string *)&local_3d0);
  std::allocator<char>::~allocator((allocator<char> *)((long)&compilation_1.size + 7));
  std::__cxx11::string::~string((string *)&local_380);
  std::allocator<char>::~allocator((allocator<char> *)&local_381);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_410,"triple",&local_411);
  pmVar2 = std::
           unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::typed_address<pstore::indirect_string>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::typed_address<pstore::indirect_string>_>_>_>
           ::operator[]((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::typed_address<pstore::indirect_string>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::typed_address<pstore::indirect_string>_>_>_>
                         *)local_90,&local_410);
  local_3f0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(pmVar2->a_).a_;
  local_420._M_current =
       (definition *)
       std::begin<std::vector<pstore::repo::definition,std::allocator<pstore::repo::definition>>>
                 ((vector<pstore::repo::definition,_std::allocator<pstore::repo::definition>_> *)
                  local_2c8);
  local_428._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
       std::end<std::vector<pstore::repo::definition,std::allocator<pstore::repo::definition>>>
                 ((vector<pstore::repo::definition,_std::allocator<pstore::repo::definition>_> *)
                  local_2c8);
  eVar14 = pstore::repo::compilation::
           alloc<pstore::transaction<std::unique_lock<mock_mutex>>,__gnu_cxx::__normal_iterator<pstore::repo::definition*,std::vector<pstore::repo::definition,std::allocator<pstore::repo::definition>>>>
                     ((transaction<std::unique_lock<mock_mutex>_> *)local_278,
                      (typed_address<pstore::indirect_string>)local_3f0._M_pi,local_420,
                      (__normal_iterator<pstore::repo::definition_*,_std::vector<pstore::repo::definition,_std::allocator<pstore::repo::definition>_>_>
                       )local_428._M_pi);
  compilation_1.addr.a_.a_ = (address)eVar14.size;
  local_3e8.a_ = (value_type)eVar14.addr.a_.a_;
  std::__cxx11::string::~string((string *)&local_410);
  std::allocator<char>::~allocator((allocator<char> *)&local_411);
  local_42c.distance_ = 0;
  pstore::exchange::export_ns::indent::indent(&local_42c);
  pdVar12 = &(this->super_ExchangeCompilation).export_db_;
  pstore::database::getro<pstore::repo::compilation,void>
            ((database *)local_440,(extent<pstore::repo::compilation> *)pdVar12);
  peVar3 = std::
           __shared_ptr_access<const_pstore::repo::compilation,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator*((__shared_ptr_access<const_pstore::repo::compilation,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)local_440);
  pcVar9 = (char *)0x0;
  pstore::exchange::export_ns::emit_compilation
            ((ostream_base *)((long)&exported_fragment_stream.str_.field_2 + 8),local_42c,pdVar12,
             peVar3,(string_mapping *)local_f0,false);
  std::shared_ptr<const_pstore::repo::compilation>::~shared_ptr
            ((shared_ptr<const_pstore::repo::compilation> *)local_440);
  pstore::transaction_base::commit((transaction_base *)local_278);
  std::vector<pstore::repo::definition,_std::allocator<pstore::repo::definition>_>::~vector
            ((vector<pstore::repo::definition,_std::allocator<pstore::repo::definition>_> *)
             local_2c8);
  pstore::transaction<std::unique_lock<mock_mutex>_>::~transaction
            ((transaction<std::unique_lock<mock_mutex>_> *)local_278);
  std::unique_lock<mock_mutex>::unique_lock
            ((unique_lock<mock_mutex> *)&imported_names.lookup_._M_h._M_single_bucket,
             (mutex_type *)&transaction.lock_.field_0xf);
  ::begin((transaction<std::unique_lock<mock_mutex>_> *)local_480,
          &(this->super_ExchangeCompilation).import_db_,
          (unique_lock<mock_mutex> *)&imported_names.lookup_._M_h._M_single_bucket);
  std::unique_lock<mock_mutex>::~unique_lock
            ((unique_lock<mock_mutex> *)&imported_names.lookup_._M_h._M_single_bucket);
  pstore::exchange::import_ns::string_mapping::string_mapping
            ((string_mapping *)&name_parser.coordinate_);
  anon_unknown.dwarf_944bc::import_strings_parser
            ((parser<pstore::exchange::import_ns::callbacks> *)&gtest_ar_.message_,
             (transaction *)local_480,(string_mapping *)&name_parser.coordinate_);
  psVar4 = pstore::exchange::export_ns::ostringstream::str_abi_cxx11_((ostringstream *)local_148);
  ppVar5 = pstore::json::parser<pstore::exchange::import_ns::callbacks>::input
                     ((parser<pstore::exchange::import_ns::callbacks> *)&gtest_ar_.message_,psVar4);
  pstore::json::parser<pstore::exchange::import_ns::callbacks>::eof(ppVar5);
  local_5c9 = pstore::json::parser<pstore::exchange::import_ns::callbacks>::has_error
                        ((parser<pstore::exchange::import_ns::callbacks> *)&gtest_ar_.message_);
  local_5c9 = !local_5c9;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_5c8,&local_5c9,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_5c8);
  if (!bVar1) {
    testing::Message::Message(&local_5d8);
    pMVar6 = testing::Message::operator<<(&local_5d8,(char (*) [17])"JSON error was: ");
    peVar7 = pstore::json::parser<pstore::exchange::import_ns::callbacks>::last_error
                       ((parser<pstore::exchange::import_ns::callbacks> *)&gtest_ar_.message_);
    std::error_code::message_abi_cxx11_(&local_5f8,peVar7);
    pMVar6 = testing::Message::operator<<(pMVar6,&local_5f8);
    local_5f9 = ' ';
    pMVar6 = testing::Message::operator<<(pMVar6,&local_5f9);
    local_604 = pstore::json::parser<pstore::exchange::import_ns::callbacks>::coordinate
                          ((parser<pstore::exchange::import_ns::callbacks> *)&gtest_ar_.message_);
    pMVar6 = testing::Message::operator<<(pMVar6,&local_604);
    local_605 = '\n';
    pMVar6 = testing::Message::operator<<(pMVar6,&local_605);
    psVar4 = pstore::exchange::export_ns::ostringstream::str_abi_cxx11_((ostringstream *)local_148);
    pMVar6 = testing::Message::operator<<(pMVar6,psVar4);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_630,(internal *)local_5c8,(AssertionResult *)"name_parser.has_error ()","true"
               ,"false",pcVar9);
    pcVar8 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_610,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/exchange/test_compilation.cpp"
               ,0x10a,pcVar8);
    testing::internal::AssertHelper::operator=(&local_610,pMVar6);
    testing::internal::AssertHelper::~AssertHelper(&local_610);
    std::__cxx11::string::~string((string *)&local_630);
    std::__cxx11::string::~string((string *)&local_5f8);
    testing::Message::~Message(&local_5d8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_5c8);
  pstore::json::parser<pstore::exchange::import_ns::callbacks>::~parser
            ((parser<pstore::exchange::import_ns::callbacks> *)&gtest_ar_.message_);
  if (bVar1) {
    anon_unknown.dwarf_944bc::import_fragment_parser
              ((parser<pstore::exchange::import_ns::callbacks> *)&gtest_ar__1.message_,
               (transaction *)local_480,(string_mapping *)&name_parser.coordinate_,
               (digest *)((long)&exported_compilation_stream.str_.field_2 + 8));
    psVar4 = pstore::exchange::export_ns::ostringstream::str_abi_cxx11_((ostringstream *)local_238);
    ppVar5 = pstore::json::parser<pstore::exchange::import_ns::callbacks>::input
                       ((parser<pstore::exchange::import_ns::callbacks> *)&gtest_ar__1.message_,
                        psVar4);
    pstore::json::parser<pstore::exchange::import_ns::callbacks>::eof(ppVar5);
    local_6f1 = pstore::json::parser<pstore::exchange::import_ns::callbacks>::has_error
                          ((parser<pstore::exchange::import_ns::callbacks> *)&gtest_ar__1.message_);
    local_6f1 = !local_6f1;
    testing::AssertionResult::AssertionResult<bool>
              ((AssertionResult *)local_6f0,&local_6f1,(type *)0x0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_6f0);
    if (!bVar1) {
      testing::Message::Message(&local_700);
      pMVar6 = testing::Message::operator<<(&local_700,(char (*) [17])"JSON error was: ");
      peVar7 = pstore::json::parser<pstore::exchange::import_ns::callbacks>::last_error
                         ((parser<pstore::exchange::import_ns::callbacks> *)&gtest_ar__1.message_);
      std::error_code::message_abi_cxx11_(&local_720,peVar7);
      pMVar6 = testing::Message::operator<<(pMVar6,&local_720);
      local_721 = ' ';
      pMVar6 = testing::Message::operator<<(pMVar6,&local_721);
      local_72c = pstore::json::parser<pstore::exchange::import_ns::callbacks>::coordinate
                            ((parser<pstore::exchange::import_ns::callbacks> *)&gtest_ar__1.message_
                            );
      pMVar6 = testing::Message::operator<<(pMVar6,&local_72c);
      local_72d = '\n';
      pMVar6 = testing::Message::operator<<(pMVar6,&local_72d);
      psVar4 = pstore::exchange::export_ns::ostringstream::str_abi_cxx11_
                         ((ostringstream *)local_238);
      pMVar6 = testing::Message::operator<<(pMVar6,psVar4);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)
                 &fragment_index.
                  super___shared_ptr<pstore::index::hamt_map<pstore::uint128,_pstore::extent<pstore::repo::fragment>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount,(internal *)local_6f0,
                 (AssertionResult *)"fragment_parser.has_error ()","true","false",pcVar9);
      pcVar8 = (char *)std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                (&local_738,kFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/exchange/test_compilation.cpp"
                 ,0x113,pcVar8);
      testing::internal::AssertHelper::operator=(&local_738,pMVar6);
      testing::internal::AssertHelper::~AssertHelper(&local_738);
      std::__cxx11::string::~string
                ((string *)
                 &fragment_index.
                  super___shared_ptr<pstore::index::hamt_map<pstore::uint128,_pstore::extent<pstore::repo::fragment>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount);
      std::__cxx11::string::~string((string *)&local_720);
      testing::Message::~Message(&local_700);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_6f0);
    pstore::json::parser<pstore::exchange::import_ns::callbacks>::~parser
              ((parser<pstore::exchange::import_ns::callbacks> *)&gtest_ar__1.message_);
    if (bVar1) {
      pstore::index::
      get_index<(pstore::trailer::indices)2,pstore::database,pstore::index::hamt_map<pstore::uint128,pstore::extent<pstore::repo::fragment>,pstore::index::u128_hash,std::equal_to<pstore::uint128>>>
                ((index *)&compilation_parser.coordinate_,
                 &(this->super_ExchangeCompilation).import_db_,true);
      anon_unknown.dwarf_944bc::import_compilation_parser
                ((parser<pstore::exchange::import_ns::callbacks> *)&gtest_ar__2.message_,
                 (transaction *)local_480,(string_mapping *)&name_parser.coordinate_,
                 (shared_ptr<pstore::index::hamt_map<pstore::uint128,_pstore::extent<pstore::repo::fragment>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>_>
                  *)&compilation_parser.coordinate_,(digest *)((long)&fragment_digest.v_ + 8));
      psVar4 = pstore::exchange::export_ns::ostringstream::str_abi_cxx11_
                         ((ostringstream *)((long)&exported_fragment_stream.str_.field_2 + 8));
      ppVar5 = pstore::json::parser<pstore::exchange::import_ns::callbacks>::input
                         ((parser<pstore::exchange::import_ns::callbacks> *)&gtest_ar__2.message_,
                          psVar4);
      pstore::json::parser<pstore::exchange::import_ns::callbacks>::eof(ppVar5);
      local_821 = pstore::json::parser<pstore::exchange::import_ns::callbacks>::has_error
                            ((parser<pstore::exchange::import_ns::callbacks> *)&gtest_ar__2.message_
                            );
      local_821 = !local_821;
      testing::AssertionResult::AssertionResult<bool>
                ((AssertionResult *)local_820,&local_821,(type *)0x0);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_820);
      if (!bVar1) {
        testing::Message::Message(&local_830);
        pMVar6 = testing::Message::operator<<(&local_830,(char (*) [17])"JSON error was: ");
        peVar7 = pstore::json::parser<pstore::exchange::import_ns::callbacks>::last_error
                           ((parser<pstore::exchange::import_ns::callbacks> *)&gtest_ar__2.message_)
        ;
        std::error_code::message_abi_cxx11_(&local_850,peVar7);
        pMVar6 = testing::Message::operator<<(pMVar6,&local_850);
        local_851 = ' ';
        pMVar6 = testing::Message::operator<<(pMVar6,&local_851);
        local_85c = pstore::json::parser<pstore::exchange::import_ns::callbacks>::coordinate
                              ((parser<pstore::exchange::import_ns::callbacks> *)
                               &gtest_ar__2.message_);
        pMVar6 = testing::Message::operator<<(pMVar6,&local_85c);
        local_85d = '\n';
        pMVar6 = testing::Message::operator<<(pMVar6,&local_85d);
        psVar4 = pstore::exchange::export_ns::ostringstream::str_abi_cxx11_
                           ((ostringstream *)((long)&exported_fragment_stream.str_.field_2 + 8));
        pMVar6 = testing::Message::operator<<(pMVar6,psVar4);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)
                   &compilation_index.
                    super___shared_ptr<pstore::index::hamt_map<pstore::uint128,_pstore::extent<pstore::repo::compilation>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>,_(__gnu_cxx::_Lock_policy)2>
                    ._M_refcount,(internal *)local_820,
                   (AssertionResult *)"compilation_parser.has_error ()","true","false",pcVar9);
        pcVar9 = (char *)std::__cxx11::string::c_str();
        testing::internal::AssertHelper::AssertHelper
                  (&local_868,kFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/exchange/test_compilation.cpp"
                   ,0x11e,pcVar9);
        testing::internal::AssertHelper::operator=(&local_868,pMVar6);
        testing::internal::AssertHelper::~AssertHelper(&local_868);
        std::__cxx11::string::~string
                  ((string *)
                   &compilation_index.
                    super___shared_ptr<pstore::index::hamt_map<pstore::uint128,_pstore::extent<pstore::repo::compilation>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>,_(__gnu_cxx::_Lock_policy)2>
                    ._M_refcount);
        std::__cxx11::string::~string((string *)&local_850);
        testing::Message::~Message(&local_830);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_820);
      pstore::json::parser<pstore::exchange::import_ns::callbacks>::~parser
                ((parser<pstore::exchange::import_ns::callbacks> *)&gtest_ar__2.message_);
      std::
      shared_ptr<pstore::index::hamt_map<pstore::uint128,_pstore::extent<pstore::repo::fragment>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>_>
      ::~shared_ptr((shared_ptr<pstore::index::hamt_map<pstore::uint128,_pstore::extent<pstore::repo::fragment>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>_>
                     *)&compilation_parser.coordinate_);
      if (bVar1) {
        pstore::index::
        get_index<(pstore::trailer::indices)0,pstore::database,pstore::index::hamt_map<pstore::uint128,pstore::extent<pstore::repo::compilation>,pstore::index::u128_hash,std::equal_to<pstore::uint128>>>
                  ((index *)&pos.pos_,&(this->super_ExchangeCompilation).import_db_,true);
        peVar10 = std::
                  __shared_ptr_access<pstore::index::hamt_map<pstore::uint128,_pstore::extent<pstore::repo::compilation>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  ::operator->((__shared_ptr_access<pstore::index::hamt_map<pstore::uint128,_pstore::extent<pstore::repo::compilation>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                *)&pos.pos_);
        pstore::index::
        hamt_map<pstore::uint128,pstore::extent<pstore::repo::compilation>,pstore::index::u128_hash,std::equal_to<pstore::uint128>>
        ::find<pstore::uint128,void>
                  ((const_iterator *)&gtest_ar.message_,
                   (hamt_map<pstore::uint128,pstore::extent<pstore::repo::compilation>,pstore::index::u128_hash,std::equal_to<pstore::uint128>>
                    *)peVar10,&(this->super_ExchangeCompilation).import_db_,
                   (uint128 *)((long)&fragment_digest.v_ + 8));
        peVar10 = std::
                  __shared_ptr_access<pstore::index::hamt_map<pstore::uint128,_pstore::extent<pstore::repo::compilation>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  ::operator->((__shared_ptr_access<pstore::index::hamt_map<pstore::uint128,_pstore::extent<pstore::repo::compilation>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                *)&pos.pos_);
        pstore::index::
        hamt_map<pstore::uint128,_pstore::extent<pstore::repo::compilation>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>
        ::end(&local_a88,peVar10,&(this->super_ExchangeCompilation).import_db_);
        addr.a_.a_ = (address)&gtest_ar.message_;
        testing::internal::
        CmpHelperNE<pstore::index::hamt_map<pstore::uint128,pstore::extent<pstore::repo::compilation>,pstore::index::u128_hash,std::equal_to<pstore::uint128>>::iterator_base<true>,pstore::index::hamt_map<pstore::uint128,pstore::extent<pstore::repo::compilation>,pstore::index::u128_hash,std::equal_to<pstore::uint128>>::iterator_base<false>>
                  ((internal *)local_998,"pos","compilation_index->end (import_db_)",
                   (iterator_base<true> *)addr.a_.a_,&local_a88);
        pstore::index::
        hamt_map<pstore::uint128,_pstore::extent<pstore::repo::compilation>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>
        ::iterator_base<false>::~iterator_base(&local_a88);
        bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_998);
        if (!bVar1) {
          testing::Message::Message(&local_a90);
          pMVar6 = testing::Message::operator<<
                             (&local_a90,
                              (char (*) [52])"Compilation was not found in the index after import");
          pcVar9 = testing::AssertionResult::failure_message((AssertionResult *)local_998);
          addr.a_.a_ = (address)0x128;
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)
                     &compilation.
                      super___shared_ptr<const_pstore::repo::compilation,_(__gnu_cxx::_Lock_policy)2>
                      ._M_refcount,kFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/exchange/test_compilation.cpp"
                     ,0x128,pcVar9);
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)
                     &compilation.
                      super___shared_ptr<const_pstore::repo::compilation,_(__gnu_cxx::_Lock_policy)2>
                      ._M_refcount,pMVar6);
          testing::internal::AssertHelper::~AssertHelper
                    ((AssertHelper *)
                     &compilation.
                      super___shared_ptr<const_pstore::repo::compilation,_(__gnu_cxx::_Lock_policy)2>
                      ._M_refcount);
          testing::Message::~Message(&local_a90);
        }
        testing::AssertionResult::~AssertionResult((AssertionResult *)local_998);
        if (bVar1) {
          pstore::index::
          hamt_map<pstore::uint128,_pstore::extent<pstore::repo::compilation>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>
          ::iterator_base<true>::operator->((iterator_base<true> *)&gtest_ar.message_);
          pstore::database::getro<pstore::repo::compilation,void>
                    ((database *)&gtest_ar_1.message_,
                     (extent<pstore::repo::compilation> *)
                     &(this->super_ExchangeCompilation).import_db_);
          peVar3 = std::
                   __shared_ptr_access<const_pstore::repo::compilation,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->((__shared_ptr_access<const_pstore::repo::compilation,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)&gtest_ar_1.message_);
          local_ae0.a_ = (value_type)pstore::repo::compilation::triple(peVar3);
          (anonymous_namespace)::load_string_abi_cxx11_
                    (&local_ad8,
                     (_anonymous_namespace_ *)&(this->super_ExchangeCompilation).import_db_,
                     (database *)local_ae0.a_,addr);
          testing::internal::EqHelper::
          Compare<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*,_nullptr>
                    ((EqHelper *)local_ab8,"load_string (import_db_, compilation->triple ())",
                     "triple",&local_ad8,&stack0xffffffffffffffd0);
          std::__cxx11::string::~string((string *)&local_ad8);
          bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_ab8);
          if (!bVar1) {
            testing::Message::Message(&local_ae8);
            pcVar9 = testing::AssertionResult::failure_message((AssertionResult *)local_ab8);
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/exchange/test_compilation.cpp"
                       ,300,pcVar9);
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)&gtest_ar_2.message_,&local_ae8);
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
            testing::Message::~Message(&local_ae8);
          }
          testing::AssertionResult::~AssertionResult((AssertionResult *)local_ab8);
          peVar3 = std::
                   __shared_ptr_access<const_pstore::repo::compilation,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->((__shared_ptr_access<const_pstore::repo::compilation,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)&gtest_ar_1.message_);
          local_b04 = pstore::repo::compilation::size(peVar3);
          local_b08 = 2;
          testing::internal::EqHelper::Compare<unsigned_int,_unsigned_int,_nullptr>
                    ((EqHelper *)local_b00,"compilation->size ()","2U",&local_b04,&local_b08);
          bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_b00);
          if (!bVar1) {
            testing::Message::Message(&local_b10);
            pcVar9 = testing::AssertionResult::failure_message((AssertionResult *)local_b00);
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&def1,kFatalFailure,
                       "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/exchange/test_compilation.cpp"
                       ,0x12d,pcVar9);
            testing::internal::AssertHelper::operator=((AssertHelper *)&def1,&local_b10);
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&def1);
            testing::Message::~Message(&local_b10);
          }
          testing::AssertionResult::~AssertionResult((AssertionResult *)local_b00);
          if (bVar1) {
            peVar3 = std::
                     __shared_ptr_access<const_pstore::repo::compilation,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                     ::operator*((__shared_ptr_access<const_pstore::repo::compilation,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                  *)&gtest_ar_1.message_);
            _Var11._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl =
                 (tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )pstore::repo::compilation::operator[](peVar3,0);
            gtest_ar_3.message_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl =
                 (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                  )(__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                    )_Var11._M_t.
                     super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     .
                     super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                     ._M_head_impl;
            testing::internal::EqHelper::Compare<pstore::uint128,_pstore::uint128,_nullptr>
                      ((EqHelper *)local_b30,"def1.digest","fragment_digest",
                       (uint128 *)
                       _Var11._M_t.
                       super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       .
                       super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                       ._M_head_impl,
                       (uint128 *)((long)&exported_compilation_stream.str_.field_2 + 8));
            bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_b30);
            if (!bVar1) {
              testing::Message::Message(&local_b38);
              pcVar9 = testing::AssertionResult::failure_message((AssertionResult *)local_b30);
              _Var11._M_t.
              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
              ._M_head_impl =
                   (tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )(_Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )0x130;
              testing::internal::AssertHelper::AssertHelper
                        ((AssertHelper *)&gtest_ar_4.message_,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/exchange/test_compilation.cpp"
                         ,0x130,pcVar9);
              testing::internal::AssertHelper::operator=
                        ((AssertHelper *)&gtest_ar_4.message_,&local_b38);
              testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_4.message_);
              testing::Message::~Message(&local_b38);
            }
            testing::AssertionResult::~AssertionResult((AssertionResult *)local_b30);
            local_b78 = *(database **)
                         ((long)gtest_ar_3.message_._M_t.
                                super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                .
                                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                ._M_head_impl + 0x20);
            (anonymous_namespace)::load_string_abi_cxx11_
                      (&local_b70,
                       (_anonymous_namespace_ *)&(this->super_ExchangeCompilation).import_db_,
                       local_b78,
                       (typed_address<pstore::indirect_string>)
                       _Var11._M_t.
                       super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       .
                       super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                       ._M_head_impl);
            testing::internal::EqHelper::
            Compare<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*,_nullptr>
                      ((EqHelper *)local_b50,"load_string (import_db_, def1.name)","name1",
                       &local_b70,&name2);
            std::__cxx11::string::~string((string *)&local_b70);
            bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_b50);
            if (!bVar1) {
              testing::Message::Message(&local_b80);
              pcVar9 = testing::AssertionResult::failure_message((AssertionResult *)local_b50);
              testing::internal::AssertHelper::AssertHelper
                        ((AssertHelper *)&gtest_ar_5.message_,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/exchange/test_compilation.cpp"
                         ,0x131,pcVar9);
              testing::internal::AssertHelper::operator=
                        ((AssertHelper *)&gtest_ar_5.message_,&local_b80);
              testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_5.message_);
              testing::Message::~Message(&local_b80);
            }
            testing::AssertionResult::~AssertionResult((AssertionResult *)local_b50);
            local_b99 = pstore::repo::definition::linkage
                                  ((definition *)
                                   gtest_ar_3.message_._M_t.
                                   super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   .
                                   super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                   ._M_head_impl);
            local_b9a = external;
            testing::internal::EqHelper::
            Compare<pstore::repo::linkage,_pstore::repo::linkage,_nullptr>
                      ((EqHelper *)local_b98,"def1.linkage ()","pstore::repo::linkage::external",
                       &local_b99,&local_b9a);
            bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_b98);
            if (!bVar1) {
              testing::Message::Message(&local_ba8);
              pcVar9 = testing::AssertionResult::failure_message((AssertionResult *)local_b98);
              testing::internal::AssertHelper::AssertHelper
                        ((AssertHelper *)&gtest_ar_6.message_,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/exchange/test_compilation.cpp"
                         ,0x132,pcVar9);
              testing::internal::AssertHelper::operator=
                        ((AssertHelper *)&gtest_ar_6.message_,&local_ba8);
              testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_6.message_);
              testing::Message::~Message(&local_ba8);
            }
            testing::AssertionResult::~AssertionResult((AssertionResult *)local_b98);
            local_bc1 = pstore::repo::definition::visibility
                                  ((definition *)
                                   gtest_ar_3.message_._M_t.
                                   super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   .
                                   super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                   ._M_head_impl);
            local_bc2 = hidden_vis;
            testing::internal::EqHelper::
            Compare<pstore::repo::visibility,_pstore::repo::visibility,_nullptr>
                      ((EqHelper *)local_bc0,"def1.visibility ()",
                       "pstore::repo::visibility::hidden_vis",&local_bc1,&local_bc2);
            bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_bc0);
            if (!bVar1) {
              testing::Message::Message(&local_bd0);
              pcVar9 = testing::AssertionResult::failure_message((AssertionResult *)local_bc0);
              testing::internal::AssertHelper::AssertHelper
                        ((AssertHelper *)&def2,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/exchange/test_compilation.cpp"
                         ,0x133,pcVar9);
              testing::internal::AssertHelper::operator=((AssertHelper *)&def2,&local_bd0);
              testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&def2);
              testing::Message::~Message(&local_bd0);
            }
            testing::AssertionResult::~AssertionResult((AssertionResult *)local_bc0);
            peVar3 = std::
                     __shared_ptr_access<const_pstore::repo::compilation,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                     ::operator*((__shared_ptr_access<const_pstore::repo::compilation,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                  *)&gtest_ar_1.message_);
            _Var11._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl =
                 (tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )pstore::repo::compilation::operator[](peVar3,1);
            gtest_ar_7.message_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl =
                 (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                  )(__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                    )_Var11._M_t.
                     super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     .
                     super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                     ._M_head_impl;
            testing::internal::EqHelper::Compare<pstore::uint128,_pstore::uint128,_nullptr>
                      ((EqHelper *)local_bf0,"def2.digest","fragment_digest",
                       (uint128 *)
                       _Var11._M_t.
                       super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       .
                       super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                       ._M_head_impl,
                       (uint128 *)((long)&exported_compilation_stream.str_.field_2 + 8));
            bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_bf0);
            if (!bVar1) {
              testing::Message::Message(&local_bf8);
              pcVar9 = testing::AssertionResult::failure_message((AssertionResult *)local_bf0);
              _Var11._M_t.
              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
              ._M_head_impl =
                   (tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )(_Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )0x137;
              testing::internal::AssertHelper::AssertHelper
                        ((AssertHelper *)&gtest_ar_8.message_,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/exchange/test_compilation.cpp"
                         ,0x137,pcVar9);
              testing::internal::AssertHelper::operator=
                        ((AssertHelper *)&gtest_ar_8.message_,&local_bf8);
              testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_8.message_);
              testing::Message::~Message(&local_bf8);
            }
            testing::AssertionResult::~AssertionResult((AssertionResult *)local_bf0);
            local_c38 = *(database **)
                         ((long)gtest_ar_7.message_._M_t.
                                super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                .
                                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                ._M_head_impl + 0x20);
            (anonymous_namespace)::load_string_abi_cxx11_
                      (&local_c30,
                       (_anonymous_namespace_ *)&(this->super_ExchangeCompilation).import_db_,
                       local_c38,
                       (typed_address<pstore::indirect_string>)
                       _Var11._M_t.
                       super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       .
                       super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                       ._M_head_impl);
            testing::internal::EqHelper::
            Compare<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*,_nullptr>
                      ((EqHelper *)local_c10,"load_string (import_db_, def2.name)","name2",
                       &local_c30,&triple);
            std::__cxx11::string::~string((string *)&local_c30);
            bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_c10);
            if (!bVar1) {
              testing::Message::Message(&local_c40);
              pcVar9 = testing::AssertionResult::failure_message((AssertionResult *)local_c10);
              testing::internal::AssertHelper::AssertHelper
                        ((AssertHelper *)&gtest_ar_9.message_,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/exchange/test_compilation.cpp"
                         ,0x138,pcVar9);
              testing::internal::AssertHelper::operator=
                        ((AssertHelper *)&gtest_ar_9.message_,&local_c40);
              testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_9.message_);
              testing::Message::~Message(&local_c40);
            }
            testing::AssertionResult::~AssertionResult((AssertionResult *)local_c10);
            local_c59 = pstore::repo::definition::linkage
                                  ((definition *)
                                   gtest_ar_7.message_._M_t.
                                   super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   .
                                   super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                   ._M_head_impl);
            local_c5a = link_once_any;
            testing::internal::EqHelper::
            Compare<pstore::repo::linkage,_pstore::repo::linkage,_nullptr>
                      ((EqHelper *)local_c58,"def2.linkage ()",
                       "pstore::repo::linkage::link_once_any",&local_c59,&local_c5a);
            bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_c58);
            if (!bVar1) {
              testing::Message::Message(&local_c68);
              pcVar9 = testing::AssertionResult::failure_message((AssertionResult *)local_c58);
              testing::internal::AssertHelper::AssertHelper
                        ((AssertHelper *)&gtest_ar_10.message_,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/exchange/test_compilation.cpp"
                         ,0x139,pcVar9);
              testing::internal::AssertHelper::operator=
                        ((AssertHelper *)&gtest_ar_10.message_,&local_c68);
              testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_10.message_);
              testing::Message::~Message(&local_c68);
            }
            testing::AssertionResult::~AssertionResult((AssertionResult *)local_c58);
            local_c81 = pstore::repo::definition::visibility
                                  ((definition *)
                                   gtest_ar_7.message_._M_t.
                                   super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   .
                                   super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                   ._M_head_impl);
            local_c82 = default_vis;
            testing::internal::EqHelper::
            Compare<pstore::repo::visibility,_pstore::repo::visibility,_nullptr>
                      ((EqHelper *)local_c80,"def2.visibility ()",
                       "pstore::repo::visibility::default_vis",&local_c81,&local_c82);
            bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_c80);
            if (!bVar1) {
              testing::Message::Message(&local_c90);
              pcVar9 = testing::AssertionResult::failure_message((AssertionResult *)local_c80);
              testing::internal::AssertHelper::AssertHelper
                        (&local_c98,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/exchange/test_compilation.cpp"
                         ,0x13a,pcVar9);
              testing::internal::AssertHelper::operator=(&local_c98,&local_c90);
              testing::internal::AssertHelper::~AssertHelper(&local_c98);
              testing::Message::~Message(&local_c90);
            }
            testing::AssertionResult::~AssertionResult((AssertionResult *)local_c80);
            pstore::transaction_base::commit((transaction_base *)local_480);
          }
          std::shared_ptr<const_pstore::repo::compilation>::~shared_ptr
                    ((shared_ptr<const_pstore::repo::compilation> *)&gtest_ar_1.message_);
        }
        pstore::index::
        hamt_map<pstore::uint128,_pstore::extent<pstore::repo::compilation>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>
        ::iterator_base<true>::~iterator_base((iterator_base<true> *)&gtest_ar.message_);
        std::
        shared_ptr<pstore::index::hamt_map<pstore::uint128,_pstore::extent<pstore::repo::compilation>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>_>
        ::~shared_ptr((shared_ptr<pstore::index::hamt_map<pstore::uint128,_pstore::extent<pstore::repo::compilation>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>_>
                       *)&pos.pos_);
      }
    }
  }
  pstore::exchange::import_ns::string_mapping::~string_mapping
            ((string_mapping *)&name_parser.coordinate_);
  pstore::transaction<std::unique_lock<mock_mutex>_>::~transaction
            ((transaction<std::unique_lock<mock_mutex>_> *)local_480);
  pstore::exchange::export_ns::ostringstream::~ostringstream((ostringstream *)local_238);
  pstore::exchange::export_ns::ostringstream::~ostringstream
            ((ostringstream *)((long)&exported_fragment_stream.str_.field_2 + 8));
  pstore::exchange::export_ns::ostringstream::~ostringstream((ostringstream *)local_148);
  pstore::exchange::export_ns::string_mapping::~string_mapping((string_mapping *)local_f0);
  std::
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::typed_address<pstore::indirect_string>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::typed_address<pstore::indirect_string>_>_>_>
  ::~unordered_map((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::typed_address<pstore::indirect_string>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::typed_address<pstore::indirect_string>_>_>_>
                    *)local_90);
  return;
}

Assistant:

TEST_F (ExchangeCompilation, TwoDefinitions) {
    using namespace pstore::exchange;
    constexpr auto comments = false;

    // Add names to the store so that external fixups can use then. add_export_strings()
    // yields a mapping from each name to its indirect-address.
    constexpr auto * name1 = "name1";
    constexpr auto * name2 = "name2";
    constexpr auto * triple = "triple";
    constexpr auto name_index = pstore::trailer::indices::name;

    std::array<pstore::gsl::czstring, 3> names{{triple, name1, name2}};
    std::unordered_map<std::string, pstore::typed_address<pstore::indirect_string>> indir_strings;
    add_export_strings<name_index> (export_db_, std::begin (names), std::end (names),
                                    std::inserter (indir_strings, std::end (indir_strings)));

    // Write the names that we just created as JSON.
    export_ns::string_mapping exported_names{export_db_, export_ns::name_index_tag ()};
    export_ns::ostringstream exported_names_stream;
    export_ns::emit_strings<name_index> (exported_names_stream, export_ns::indent{}, export_db_,
                                         export_db_.get_current_revision (), "", &exported_names,
                                         comments);

    // Now build a single fragment and a compilation that references it then export them.
    constexpr pstore::index::digest compilation_digest{0x12345678, 0x9ABCDEF0};
    constexpr pstore::index::digest fragment_digest{0x9ABCDEF0, 0x12345678};

    export_ns::ostringstream exported_compilation_stream;
    export_ns::ostringstream exported_fragment_stream;

    {
        mock_mutex mutex;
        auto transaction = begin (export_db_, transaction_lock{mutex});
        pstore::extent<pstore::repo::fragment> const fext =
            build_fragment (transaction, fragment_digest);
        emit_fragment (exported_fragment_stream, export_ns::indent{}, export_db_, exported_names,
                       export_db_.getro (fext), comments);

        std::vector<pstore::repo::definition> definitions{
            {fragment_digest, fext, indir_strings[name1], pstore::repo::linkage::external,
             pstore::repo::visibility::hidden_vis},
            {fragment_digest, fext, indir_strings[name2], pstore::repo::linkage::link_once_any,
             pstore::repo::visibility::default_vis},
        };
        pstore::extent<pstore::repo::compilation> const compilation =
            pstore::repo::compilation::alloc (transaction, indir_strings[triple],
                                              std::begin (definitions), std::end (definitions));

        emit_compilation (exported_compilation_stream, export_ns::indent{}, export_db_,
                          *export_db_.getro (compilation), exported_names, comments);
        transaction.commit ();
    }


    // Now begin to export the three pieces: the names, the fragment, and finally the compilation.
    mock_mutex mutex;
    auto transaction = begin (import_db_, transaction_lock{mutex});


    import_ns::string_mapping imported_names;
    {
        auto name_parser = import_strings_parser (&transaction, &imported_names);
        name_parser.input (exported_names_stream.str ()).eof ();
        ASSERT_FALSE (name_parser.has_error ())
            << "JSON error was: " << name_parser.last_error ().message () << ' '
            << name_parser.coordinate () << '\n'
            << exported_names_stream.str ();
    }
    {
        auto fragment_parser =
            import_fragment_parser (&transaction, &imported_names, &fragment_digest);
        fragment_parser.input (exported_fragment_stream.str ()).eof ();
        ASSERT_FALSE (fragment_parser.has_error ())
            << "JSON error was: " << fragment_parser.last_error ().message () << ' '
            << fragment_parser.coordinate () << '\n'
            << exported_fragment_stream.str ();
    }
    {
        auto const fragment_index =
            pstore::index::get_index<pstore::trailer::indices::fragment> (import_db_);
        auto compilation_parser = import_compilation_parser (&transaction, &imported_names,
                                                             fragment_index, compilation_digest);
        compilation_parser.input (exported_compilation_stream.str ()).eof ();
        ASSERT_FALSE (compilation_parser.has_error ())
            << "JSON error was: " << compilation_parser.last_error ().message () << ' '
            << compilation_parser.coordinate () << '\n'
            << exported_compilation_stream.str ();
    }

    // Everything is now imported. Let's check what the resulting compilation record looks like.
    auto const compilation_index =
        pstore::index::get_index<pstore::trailer::indices::compilation> (import_db_);
    auto const pos = compilation_index->find (import_db_, compilation_digest);
    ASSERT_NE (pos, compilation_index->end (import_db_))
        << "Compilation was not found in the index after import";

    auto const compilation = import_db_.getro (pos->second);
    EXPECT_EQ (load_string (import_db_, compilation->triple ()), triple);
    ASSERT_EQ (compilation->size (), 2U);
    {
        pstore::repo::definition const & def1 = (*compilation)[0];
        EXPECT_EQ (def1.digest, fragment_digest);
        EXPECT_EQ (load_string (import_db_, def1.name), name1);
        EXPECT_EQ (def1.linkage (), pstore::repo::linkage::external);
        EXPECT_EQ (def1.visibility (), pstore::repo::visibility::hidden_vis);
    }
    {
        pstore::repo::definition const & def2 = (*compilation)[1];
        EXPECT_EQ (def2.digest, fragment_digest);
        EXPECT_EQ (load_string (import_db_, def2.name), name2);
        EXPECT_EQ (def2.linkage (), pstore::repo::linkage::link_once_any);
        EXPECT_EQ (def2.visibility (), pstore::repo::visibility::default_vis);
    }

    transaction.commit ();
}